

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_32x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  uint8_t *puVar7;
  bool bVar8;
  ushort uVar9;
  undefined4 uVar10;
  ushort uVar19;
  ushort uVar20;
  undefined1 extraout_XMM0 [14];
  ushort uVar17;
  ushort uVar21;
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 uVar16;
  byte bVar18;
  
  dc_sum_64(left);
  uVar9 = extraout_XMM0._0_2_ + 0x20;
  uVar17 = extraout_XMM0._2_2_ + 0x20;
  uVar19 = extraout_XMM0._4_2_ + 0x20;
  uVar20 = extraout_XMM0._6_2_ + 0x20;
  auVar11._0_2_ = uVar9 >> 6;
  uVar21 = uVar20 >> 6;
  uVar1 = CONCAT22((ushort)(extraout_XMM0._8_2_ + 0x20U) >> 6,uVar21);
  auVar12._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(extraout_XMM0._10_2_ + 0x20U) >> 6,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar13._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(extraout_XMM0._12_2_ + 0x20U) >> 6,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar14._0_13_ = auVar5 << 0x30;
  bVar18 = (byte)(uVar20 >> 8);
  auVar14._14_2_ = (undefined2)(CONCAT19(bVar18 >> 6,CONCAT18(bVar18 >> 6,uVar3)) >> 0x40);
  auVar14[0xd] = (char)uVar21;
  bVar18 = (byte)(uVar19 >> 0xe);
  auVar13._12_4_ = (undefined4)(CONCAT37(auVar14._13_3_,CONCAT16((char)uVar21,uVar2)) >> 0x30);
  auVar13[0xb] = bVar18;
  uVar16 = (undefined1)(uVar19 >> 6);
  auVar12._10_6_ = (undefined6)(CONCAT55(auVar13._11_5_,CONCAT14(bVar18,uVar1)) >> 0x20);
  auVar12[9] = uVar16;
  bVar18 = (byte)(uVar17 >> 0xe);
  auVar11._8_8_ = (undefined8)(CONCAT73(auVar12._9_7_,CONCAT12(uVar16,uVar21)) >> 0x10);
  auVar11[7] = bVar18;
  auVar11[6] = bVar18;
  uVar16 = (undefined1)(uVar17 >> 6);
  auVar11[5] = uVar16;
  auVar11[4] = uVar16;
  bVar18 = (byte)(uVar9 >> 8);
  auVar11[3] = bVar18 >> 6;
  auVar11[2] = bVar18 >> 6;
  auVar15[0] = (undefined1)auVar11._0_2_;
  auVar15._2_14_ = auVar11._2_14_;
  auVar15[1] = auVar15[0];
  auVar15 = pshuflw(auVar15,auVar15,0);
  uVar10 = auVar15._0_4_;
  puVar7 = dst + 0x10;
  iVar6 = 0x40;
  while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
    *(undefined4 *)(puVar7 + -0x10) = uVar10;
    *(undefined4 *)(puVar7 + -0xc) = uVar10;
    *(undefined4 *)(puVar7 + -8) = uVar10;
    *(undefined4 *)(puVar7 + -4) = uVar10;
    *(undefined4 *)puVar7 = uVar10;
    *(undefined4 *)(puVar7 + 4) = uVar10;
    *(undefined4 *)(puVar7 + 8) = uVar10;
    *(undefined4 *)(puVar7 + 0xc) = uVar10;
    puVar7 = puVar7 + stride;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_32x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above,
                                      const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_64(left);
  const __m128i thirtytwo = _mm_set1_epi16(32);
  sum_left = _mm_add_epi16(sum_left, thirtytwo);
  sum_left = _mm_srai_epi16(sum_left, 6);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  const __m128i row = _mm_unpacklo_epi64(sum_left, sum_left);
  dc_store_32xh(&row, 64, dst, stride);
}